

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

unique_ptr<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
 get_program(int argc,char **argv)

{
  char *in_RAX;
  undefined8 *in_RDX;
  undefined4 in_register_0000003c;
  __uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
  _Var1;
  char *program_name;
  char *local_18;
  
  _Var1.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl.
  _4_4_ = in_register_0000003c;
  _Var1.
  super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
  .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>._M_head_impl.
  _0_4_ = argc;
  if ((int)argv < 3) {
    local_18 = in_RAX;
    if ((int)argv == 2) {
      std::make_unique<std::fstream,char_const*const&,std::_Ios_Openmode_const&>
                (&local_18,(_Ios_Openmode *)(in_RDX + 1));
    }
    else {
      std::make_unique<std::__cxx11::stringstream,char_const*const&>(&local_18);
    }
    *(char **)_Var1.
              super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
              _M_head_impl = local_18;
    return (__uniq_ptr_data<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>,_true,_true>
            )(tuple<std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
              )_Var1.
               super___uniq_ptr_impl<std::basic_istream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_std::default_delete<std::basic_istream<char,_std::char_traits<char>_>_>_>
               .super__Head_base<0UL,_std::basic_istream<char,_std::char_traits<char>_>_*,_false>.
               _M_head_impl;
  }
  local_18 = (char *)*in_RDX;
  ublib::failwith<void,char[8],char_const*,char[20]>
            ((char (*) [8])"Usage: ",&local_18,(char (*) [20])" [filename=code.lc]");
}

Assistant:

std::unique_ptr<std::istream> get_program(int argc, char const* const* argv) {
  if (argc > 2) {
    auto const program_name = (argc > 0) ? argv[0] : "[program]";
    ublib::failwith("Usage: ", program_name, " [filename=code.lc]");
  } else if (argc == 2) {
    return std::make_unique<std::fstream>(argv[1], std::ios_base::in);
  } else {
    return std::make_unique<std::stringstream>(default_program);
  }
}